

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testInvalidSliceStaticNoParams(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<bool> *this;
  pointer pcVar2;
  WeightParams *pWVar3;
  bool bVar4;
  int iVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  FeatureType *pFVar8;
  ArrayFeatureType *pAVar9;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  ostream *poVar10;
  string *psVar11;
  long lVar12;
  Rep *pRVar13;
  int iVar14;
  int iVar15;
  Result res1;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  undefined1 local_118 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  Model local_f0;
  Result local_c0;
  Result local_98;
  Result local_70;
  Result local_48;
  
  CoreML::Specification::Model::Model(&local_f0);
  if (local_f0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_f0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_f0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar2 = local_118 + 0x10;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = (pAVar9->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
  }
  pRVar13 = (pAVar9->shape_).rep_;
  iVar5 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar13->elements[iVar15] = 3;
  if (iVar5 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  iVar15 = iVar5 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar13->elements[iVar5] = 5;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar15 = (pAVar9->shape_).current_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 2;
  if (local_f0.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_f0.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_f0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar7->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_118);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_118._16_8_ + 1);
  }
  pFVar8 = pTVar7->type_;
  if (pFVar8 == (FeatureType *)0x0) {
    pFVar8 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar8);
    pTVar7->type_ = pFVar8;
  }
  if (pFVar8->_oneof_case_[0] == 5) {
    pAVar9 = (pFVar8->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar8);
    pFVar8->_oneof_case_[0] = 5;
    pAVar9 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar9);
    (pFVar8->Type_).multiarraytype_ = pAVar9;
  }
  pRVar1 = &pAVar9->shape_;
  iVar15 = (pAVar9->shape_).current_size_;
  iVar14 = (pAVar9->shape_).total_size_;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 1);
    iVar15 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
  }
  pRVar13 = (pAVar9->shape_).rep_;
  iVar5 = iVar15 + 1;
  (pAVar9->shape_).current_size_ = iVar5;
  pRVar13->elements[iVar15] = 3;
  if (iVar5 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar15 + 2);
    iVar5 = (pAVar9->shape_).current_size_;
    iVar14 = (pAVar9->shape_).total_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  iVar15 = iVar5 + 1;
  pRVar1->current_size_ = iVar15;
  pRVar13->elements[iVar5] = 5;
  if (iVar15 == iVar14) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,iVar5 + 2);
    iVar15 = (pAVar9->shape_).current_size_;
    pRVar13 = (pAVar9->shape_).rep_;
  }
  pRVar1->current_size_ = iVar15 + 1;
  pRVar13->elements[iVar15] = 2;
  if (local_f0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_f0);
    local_f0._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_f0.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  (local_f0.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_f0.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"output");
  if (this_01->_oneof_case_[0] == 0x3e3) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 0x3e3;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0xa0);
    CoreML::Specification::SliceStaticLayerParams::SliceStaticLayerParams(this_02.slicestatic_);
    (this_01->layer_).slicestatic_ = (SliceStaticLayerParams *)this_02;
  }
  this = &(this_02.slicestatic_)->endmasks_;
  iVar15 = ((this_02.convolution_)->outputshape_).current_size_;
  if (iVar15 == ((this_02.convolution_)->outputshape_).total_size_) {
    google::protobuf::RepeatedField<bool>::Reserve(this,iVar15 + 1);
    iVar15 = this->current_size_;
  }
  pWVar3 = (this_02.gru_)->resetgatebiasvector_;
  ((this_02.convolution_)->outputshape_).current_size_ = iVar15 + 1;
  *(undefined1 *)
   ((long)&(pWVar3->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_ + (long)iVar15) = 1;
  CoreML::validate<(MLModelType)500>((Result *)local_118,&local_f0);
  bVar4 = CoreML::Result::good((Result *)local_118);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1575);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  else {
    psVar11 = CoreML::Result::message_abi_cxx11_((Result *)local_118);
    lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2920,0);
    if (lVar12 != -1) {
      iVar15 = ((this_02.convolution_)->kernelsize_).current_size_;
      if (iVar15 == ((this_02.convolution_)->kernelsize_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&(this_02.reshape_)->targetshape_,iVar15 + 1)
        ;
        iVar15 = ((this_02.reshape_)->targetshape_).current_size_;
      }
      pWVar3 = (this_02.innerproduct_)->bias_;
      ((this_02.convolution_)->kernelsize_).current_size_ = iVar15 + 1;
      (&pWVar3->_internal_metadata_)[iVar15].
      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
      .ptr_ = (void *)0x0;
      CoreML::validate<(MLModelType)500>(&local_48,&local_f0);
      bVar4 = CoreML::Result::good(&local_48);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar10," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
LAB_00187557:
        std::ostream::put((char)poVar10);
        iVar15 = 1;
        std::ostream::flush();
      }
      else {
        psVar11 = CoreML::Result::message_abi_cxx11_(&local_48);
        lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2971,0);
        if (lVar12 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157c);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10,"res2.message().find(\"End IDs\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          goto LAB_00187557;
        }
        iVar15 = ((this_02.convolution_)->dilationfactor_).current_size_;
        if (iVar15 == ((this_02.convolution_)->dilationfactor_).total_size_) {
          google::protobuf::RepeatedField<long>::Reserve
                    (&(this_02.slicestatic_)->endids_,iVar15 + 1);
          iVar15 = ((this_02.slicestatic_)->endids_).current_size_;
        }
        pWVar3 = (this_02.scale_)->bias_;
        ((this_02.convolution_)->dilationfactor_).current_size_ = iVar15 + 1;
        (&pWVar3->_internal_metadata_)[iVar15].
        super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
        .ptr_ = (void *)0x5;
        CoreML::validate<(MLModelType)500>(&local_70,&local_f0);
        bVar4 = CoreML::Result::good(&local_70);
        if (bVar4) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1581);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar10," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
          std::ostream::put((char)poVar10);
          iVar15 = 1;
          std::ostream::flush();
        }
        else {
          psVar11 = CoreML::Result::message_abi_cxx11_(&local_70);
          lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f29be,0);
          if (lVar12 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x6c);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1582);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,"res3.message().find(\"Strides\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," was false, expected true.",0x1a);
            iVar15 = 1;
            std::endl<char,std::char_traits<char>>(poVar10);
          }
          else {
            iVar15 = (this_02.bidirectionallstm_)->_cached_size_;
            if (iVar15 == ((this_02.slicestatic_)->strides_).total_size_) {
              google::protobuf::RepeatedField<long>::Reserve
                        (&(this_02.slicestatic_)->strides_,iVar15 + 1);
              iVar15 = ((this_02.slicestatic_)->strides_).current_size_;
            }
            (this_02.bidirectionallstm_)->_cached_size_ = iVar15 + 1;
            (&(this_02.convolution_)->bias_->_internal_metadata_)[iVar15].
            super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
            .ptr_ = (void *)0x1;
            CoreML::validate<(MLModelType)500>(&local_98,&local_f0);
            bVar4 = CoreML::Result::good(&local_98);
            if (bVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x6c);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1587);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10," was false, expected true.",0x1a);
LAB_00187875:
              iVar15 = 1;
              std::endl<char,std::char_traits<char>>(poVar10);
            }
            else {
              psVar11 = CoreML::Result::message_abi_cxx11_(&local_98);
              lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2a0b,0);
              if (lVar12 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1588);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10,"res4.message().find(\"Begin masks\") != std::string::npos",0x37)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," was false, expected true.",0x1a);
                goto LAB_00187875;
              }
              CoreML::Specification::SliceStaticLayerParams::add_beginmasks
                        (this_02.slicestatic_,true);
              this->current_size_ = 0;
              CoreML::validate<(MLModelType)500>(&local_c0,&local_f0);
              bVar4 = CoreML::Result::good(&local_c0);
              if (bVar4) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x6c);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158e);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,"!((res5).good())",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar10," was false, expected true.",0x1a);
LAB_00187933:
                iVar15 = 1;
                std::endl<char,std::char_traits<char>>(poVar10);
              }
              else {
                psVar11 = CoreML::Result::message_abi_cxx11_(&local_c0);
                iVar15 = 0;
                lVar12 = std::__cxx11::string::find((char *)psVar11,0x2f2a60,0);
                if (lVar12 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             ,0x6c);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158f);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,"res5.message().find(\"End masks\") != std::string::npos",0x35)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10," was false, expected true.",0x1a);
                  goto LAB_00187933;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c0.m_message._M_dataplus._M_p != &local_c0.m_message.field_2) {
                operator_delete(local_c0.m_message._M_dataplus._M_p,
                                local_c0.m_message.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98.m_message._M_dataplus._M_p != &local_98.m_message.field_2) {
              operator_delete(local_98.m_message._M_dataplus._M_p,
                              local_98.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.m_message._M_dataplus._M_p != &local_70.m_message.field_2) {
          operator_delete(local_70.m_message._M_dataplus._M_p,
                          local_70.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48.m_message._M_dataplus._M_p != &local_48.m_message.field_2) {
        operator_delete(local_48.m_message._M_dataplus._M_p,
                        local_48.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001879be;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1576);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"res1.message().find(\"Begin IDs\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  }
  std::ostream::put((char)poVar10);
  iVar15 = 1;
  std::ostream::flush();
LAB_001879be:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._8_8_ != &local_100) {
    operator_delete((void *)local_118._8_8_,local_100._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_f0);
  return iVar15;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}